

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mul.h
# Opt level: O2

void __thiscall
mp::
QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
::LinearizeQPTerms(QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
                   *this,ItemType *qc)

{
  ptr ppVar1;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  *this_00;
  int i;
  long lVar2;
  long lVar3;
  LinTerms lin_terms;
  LinTerms local_1c0;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> local_148;
  LinTerms local_a8;
  
  LinTerms::LinTerms(&lin_terms,&(qc->super_QuadAndLinTerms).super_LinTerms);
  lVar3 = 8;
  for (lVar2 = 0;
      lVar2 < (int)(qc->super_QuadAndLinTerms).super_QuadTerms.folded_.
                   super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                   .m_data.
                   super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                   .m_size; lVar2 = lVar2 + 1) {
    ppVar1 = (qc->super_QuadAndLinTerms).super_QuadTerms.folded_.
             super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
             m_data.
             super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
             m_data_ptr;
    LinearizeQPTerm(&local_a8,this,*(double *)((long)&(ppVar1->first).first + lVar3),
                    *(int *)((long)ppVar1 + lVar3 + -8),*(int *)((long)ppVar1 + lVar3 + -4));
    LinTerms::add(&lin_terms,&local_a8);
    LinTerms::~LinTerms(&local_a8);
    lVar3 = lVar3 + 0x10;
  }
  LinTerms::sort_terms(&lin_terms,true);
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
             *)(this->
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).mdl_cvt_;
  LinTerms::LinTerms(&local_1c0,&lin_terms);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            (&local_148,&local_1c0,(AlgConRhs<0>)(qc->super_AlgConRhs<0>).rhs_,true);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::AddConstraint_AS_ROOT<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>
            (this_00,&local_148);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint(&local_148);
  LinTerms::~LinTerms(&local_1c0);
  LinTerms::~LinTerms(&lin_terms);
  return;
}

Assistant:

void LinearizeQPTerms(const ItemType& qc) {
    const auto& body = qc.GetBody();
    // Copy lin terms
    auto lin_terms = body.GetLinTerms();
    // Convert quadratic terms
    const auto& qp_terms = body.GetQPTerms();
    for (int i=0; i<(int)qp_terms.size(); ++i) {
      auto c = qp_terms.coef(i);
      auto x = qp_terms.var1(i);
      auto y = qp_terms.var2(i);
      lin_terms.add( LinearizeQPTerm(c, x, y) );
    }
    // Sort linear body. AS_ROOT propagates context
    lin_terms.sort_terms();
    GetMC().AddConstraint_AS_ROOT( LinConRhs< sens >{
                             lin_terms, qc.GetRhsOrRange() } );
  }